

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowTitle(GLFWwindow *handle,char *title)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/glfw/src/window.c"
                  ,0x1f9,"void glfwSetWindowTitle(GLFWwindow *, const char *)");
  }
  if (title != (char *)0x0) {
    if (_glfw.initialized != 0) {
      _glfwPlatformSetWindowTitle((_GLFWwindow *)handle,title);
      return;
    }
    _glfwInputError(0x10001,(char *)0x0,in_RDX,in_RAX);
    return;
  }
  __assert_fail("title != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/glfw/src/window.c"
                ,0x1fa,"void glfwSetWindowTitle(GLFWwindow *, const char *)");
}

Assistant:

GLFWAPI void glfwSetWindowTitle(GLFWwindow* handle, const char* title)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(title != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowTitle(window, title);
}